

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleMenu::childAt(QAccessibleMenu *this,int x,int y)

{
  long lVar1;
  QWidget *this_00;
  ulong uVar2;
  QAccessibleInterface *pQVar3;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QAction *act;
  undefined8 in_stack_ffffffffffffffa8;
  QPoint *in_stack_ffffffffffffffb0;
  QAction *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  menu((QAccessibleMenu *)0x7daa72);
  this_00 = &menu((QAccessibleMenu *)0x7daa81)->super_QWidget;
  QPoint::QPoint(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (int)in_stack_ffffffffffffffa8);
  QWidget::mapFromGlobal(this_00,in_RDI);
  local_30 = QMenu::actionAt((QMenu *)in_RDI,in_stack_ffffffffffffffb0);
  if ((local_30 != (QAction *)0x0) && (uVar2 = QAction::isSeparator(), (uVar2 & 1) != 0)) {
    local_30 = (QAction *)0x0;
  }
  if (local_30 == (QAction *)0x0) {
    pQVar3 = (QAccessibleInterface *)0x0;
  }
  else {
    menu((QAccessibleMenu *)0x7daaf3);
    pQVar3 = getOrCreateMenu(this_00,(QAction *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QAccessibleInterface *QAccessibleMenu::childAt(int x, int y) const
{
    QAction *act = menu()->actionAt(menu()->mapFromGlobal(QPoint(x,y)));
    if (act && act->isSeparator())
        act = nullptr;
    return act ? getOrCreateMenu(menu(), act) : nullptr;
}